

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

QJsonValueRef __thiscall
QJsonObject::atImpl<QLatin1StringView>(QJsonObject *this,QLatin1StringView key)

{
  long lVar1;
  QJsonValueConstRef QVar2;
  QLatin1StringView s;
  bool bVar3;
  qsizetype qVar4;
  QCborContainerPrivate *pQVar5;
  QCborContainerPrivate *value;
  long idx;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  bool keyExists;
  QCborContainerPrivate *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  Type in_stack_ffffffffffffff24;
  qsizetype in_stack_ffffffffffffff30;
  qsizetype qVar6;
  ContainerDisposition disp;
  QCborValue *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  QCborContainerPrivate *in_stack_ffffffffffffff48;
  undefined8 local_60;
  undefined8 local_58;
  QLatin1StringView in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b128d);
  if (bVar3) {
    in_stack_ffffffffffffff48 = (QCborContainerPrivate *)operator_new(0x40);
    QCborContainerPrivate::QCborContainerPrivate
              ((QCborContainerPrivate *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
  }
  qVar4 = indexOf<QLatin1StringView>
                    (in_RDI,in_stack_ffffffffffffffb0,(bool *)in_stack_ffffffffffffff48);
  pQVar5 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b1308);
  QList<QtCbor::Element>::size(&pQVar5->elements);
  detach((QJsonObject *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pQVar5 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b1339);
  s.m_size = (qsizetype)in_stack_ffffffffffffff48;
  s.m_data = in_stack_ffffffffffffff40;
  qVar6 = qVar4;
  QCborValue::QCborValue((QCborValue *)pQVar5,s);
  disp = (ContainerDisposition)((ulong)qVar6 >> 0x20);
  QCborContainerPrivate::insertAt
            (in_stack_ffffffffffffff48,(qsizetype)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,disp);
  QCborValue::~QCborValue
            ((QCborValue *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  value = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b13a6);
  idx = qVar4 + 1;
  QJsonValue::QJsonValue((QJsonValue *)pQVar5,in_stack_ffffffffffffff24);
  QCborValue::fromJsonValue((QJsonValue *)pQVar5);
  QCborContainerPrivate::insertAt(in_stack_ffffffffffffff48,idx,(QCborValue *)value,disp);
  QCborValue::~QCborValue
            ((QCborValue *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  QJsonValue::~QJsonValue((QJsonValue *)0x1b1410);
  QJsonValueRef::QJsonValueConstRef
            ((QJsonValueRef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (QJsonObject *)in_stack_ffffffffffffff18,0x1b1434);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_4_ = (int)local_58;
    QVar2.d = (QCborContainerPrivate *)local_60;
    QVar2._12_4_ = (int)((ulong)local_58 >> 0x20);
    return (QJsonValueRef)QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValueRef QJsonObject::atImpl(T key)
{
    if (!o)
        o = new QCborContainerPrivate;

    bool keyExists = false;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists) {
        detach(o->elements.size() / 2 + 1);
        o->insertAt(index, key);
        o->insertAt(index + 1, QCborValue::fromJsonValue(QJsonValue()));
    }
    // detaching will happen if and when this QJsonValueRef is assigned to
    return QJsonValueRef(this, index / 2);
}